

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_chunk_test.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::ExtractTest_ExtractNone_Test::
~ExtractTest_ExtractNone_Test(ExtractTest_ExtractNone_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ExtractTest, ExtractNone) {
  const char* field_names[] = {"optional_int32", "optional_int64"};
  auto chunks = CreateAndCollectFields<TestAllTypes>(
      field_names, [](const FieldDescriptor* lhs, const FieldDescriptor* rhs) {
        return false;
      });

  ASSERT_EQ(chunks.size(), 2);
  auto extracted =
      ExtractFields(chunks.begin(), chunks.end(),
                    [](const FieldDescriptor* f) { return false; });

  EXPECT_THAT(extracted, IsEmpty());
}